

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O0

reference __thiscall
jsoncons::jsonpath::detail::
index_expression_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::evaluate(index_expression_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
           *this,eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 *context,reference root,path_node_type *last,reference current,
          result_options options,error_code *ec)

{
  bool bVar1;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *context_00;
  base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_RSI;
  string_view_type *in_R8;
  string_view_type sVar2;
  error_code *in_stack_00000008;
  size_t start;
  value_type j;
  result_options in_stack_0000024c;
  reference in_stack_00000250;
  reference in_stack_00000258;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_00000260;
  token_evaluator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_00000268;
  error_code *in_stack_00000280;
  undefined4 in_stack_ffffffffffffff00;
  result_options in_stack_ffffffffffffff04;
  reference in_stack_ffffffffffffff08;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_ffffffffffffff10;
  reference in_stack_ffffffffffffff18;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_ffffffffffffff20;
  base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_ffffffffffffff28;
  error_code *in_stack_ffffffffffffff40;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff90;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  reference local_8;
  
  token_evaluator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  ::evaluate(in_stack_00000268,in_stack_00000260,in_stack_00000258,in_stack_00000250,
             in_stack_0000024c,in_stack_00000280);
  bVar1 = std::error_code::operator_cast_to_bool(in_stack_00000008);
  if (bVar1) {
    local_8 = eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              ::null_value(in_stack_ffffffffffffff10);
  }
  else {
    bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is<unsigned_long>
                      ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                       0x66a0ce);
    if ((bVar1) &&
       (bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                          (in_stack_ffffffffffffff18), bVar1)) {
      basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::as<unsigned_long>
                ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      local_8 = base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                ::evaluate_tail(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                                in_stack_ffffffffffffff18,
                                (path_node_type *)in_stack_ffffffffffffff10,
                                in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                                in_stack_ffffffffffffff40);
    }
    else {
      bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                        (in_stack_ffffffffffffff18);
      if ((bVar1) &&
         (bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object
                            (in_stack_ffffffffffffff18), bVar1)) {
        sVar2 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                          (in_stack_ffffffffffffff60);
        context_00 = (eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                      *)basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                                  ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>
                                    *)sVar2._M_str,in_R8);
        local_8 = base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                  ::evaluate_tail(in_RSI,context_00,in_stack_ffffffffffffff18,
                                  (path_node_type *)in_stack_ffffffffffffff10,
                                  in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                                  (error_code *)in_R8);
      }
      else {
        local_8 = eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                  ::null_value(in_stack_ffffffffffffff10);
      }
    }
  }
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
            ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x66a349);
  return local_8;
}

Assistant:

reference evaluate(eval_context<Json,JsonReference>& context,
                           reference root,
                           const path_node_type& last, 
                           reference current, 
                           result_options options,
                           std::error_code& ec) const override
        {
            //std::cout << "index_expression_selector current: " << current << "\n";

            value_type j = expr_.evaluate(context, root, current, options, ec);

            if (!ec)
            {
                if (j.template is<std::size_t>() && current.is_array())
                {
                    std::size_t start = j.template as<std::size_t>();
                    return this->evaluate_tail(context, root, last, current.at(start), options, ec);
                }
                if (j.is_string() && current.is_object())
                {
                    return this->evaluate_tail(context, root, last, current.at(j.as_string_view()), options, ec);
                }
                return context.null_value();
            }
            return context.null_value();
        }